

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_not(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize_00;
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  int opsize;
  TCGv_i32 addr;
  TCGv_i32 dest;
  TCGv_i32 src1;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  src1 = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  opsize_00 = insn_opsize((uint)insn);
  dest = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,
                *(TCGv_i32 *)(src1 + 0x94f8),(TCGv_i32 *)&stack0xffffffffffffffc0,EA_LOADS,
                (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (dest == *(TCGv_i32 *)(src1 + 0x94f8)) {
    gen_addr_fault(pDStack_18);
  }
  else {
    addr = tcg_temp_new_i32((TCGContext_conflict2 *)src1);
    tcg_gen_not_i32((TCGContext_conflict2 *)src1,addr,dest);
    pTVar1 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,addr,
                    (TCGv_i32 *)&stack0xffffffffffffffc0,EA_STORE,
                    (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar1 == *(TCGv_i32 *)(src1 + 0x94f8)) {
      gen_addr_fault(pDStack_18);
    }
    else {
      gen_logic_cc(pDStack_18,addr,opsize_00);
    }
  }
  return;
}

Assistant:

DISAS_INSN(not)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src1;
    TCGv dest;
    TCGv addr;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src1, opsize, 1, &addr);
    dest = tcg_temp_new(tcg_ctx);
    tcg_gen_not_i32(tcg_ctx, dest, src1);
    DEST_EA(env, insn, opsize, dest, &addr);
    gen_logic_cc(s, dest, opsize);
}